

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,InputPartData *part)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 local_21;
  DeepScanLineInputFile *local_20;
  
  (this->_ctxt)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (part->context)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (part->context)._ctxt.
           super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->_ctxt)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_data).super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_20 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Imf_3_4::DeepScanLineInputFile::Data,std::allocator<Imf_3_4::DeepScanLineInputFile::Data>,Imf_3_4::Context*,int&,int&>
            (&(this->_data).
              super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Data **)&this->_data,
             (allocator<Imf_3_4::DeepScanLineInputFile::Data> *)&local_21,(Context **)&local_20,
             &part->partNumber,&part->numThreads);
  Data::initialize((this->_data).
                   super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (InputPartData* part)
    : _ctxt (part->context),
      _data (std::make_shared<Data> (&_ctxt, part->partNumber, part->numThreads))
{
    _data->initialize ();
}